

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fInfoLogQueryShared.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::verifyInfoLogQuery
          (Functional *this,ResultCollector *result,CallLogWrapper *gl,int logLen,GLuint object,
          offset_in_CallLogWrapper_to_subr getInfoLog,char *getterName)

{
  TestLog *pTVar1;
  int iVar2;
  GLenum GVar3;
  undefined8 *puVar4;
  long *plVar5;
  size_t sVar6;
  code *pcVar7;
  long *plVar8;
  size_type *psVar9;
  int iVar10;
  ulong uVar11;
  undefined8 uVar12;
  undefined4 in_register_00000084;
  code *pcVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  int written;
  string buf;
  ScopedLogSection section;
  string local_138;
  int local_114;
  ResultCollector *local_110;
  string local_108;
  long *local_e8;
  undefined8 local_e0;
  long local_d8;
  undefined8 uStack_d0;
  ScopedLogSection local_c8;
  string local_c0;
  ulong *local_a0;
  long local_98;
  ulong local_90 [2];
  int local_7c;
  ResultCollector *local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long local_50;
  long *local_48;
  code *local_40;
  GLenum local_38;
  
  pcVar13 = (code *)CONCAT44(in_register_00000084,object);
  pTVar1 = (TestLog *)(result->m_prefix)._M_dataplus._M_p;
  paVar14 = &local_108.field_2;
  local_110 = (ResultCollector *)this;
  local_108._M_dataplus._M_p = (pointer)paVar14;
  local_7c = logLen;
  local_78 = result;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"QueryAll","");
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"Query all","");
  tcu::ScopedLogSection::ScopedLogSection(&local_c8,pTVar1,&local_108,&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar14) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  iVar2 = (int)gl;
  iVar10 = iVar2 + 2;
  local_50 = (long)iVar10;
  local_108._M_dataplus._M_p = (pointer)paVar14;
  std::__cxx11::string::_M_construct((ulong)&local_108,(char)iVar10);
  local_108._M_dataplus._M_p[iVar2 + 1] = '\0';
  local_48 = (long *)((long)&local_78->m_log + getInfoLog);
  pcVar7 = pcVar13;
  if ((object & 1) != 0) {
    pcVar7 = *(code **)(pcVar13 + *local_48 + -1);
  }
  (*pcVar7)(local_48,local_7c,(ulong)gl & 0xffffffff,0,local_108._M_dataplus._M_p);
  GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_78);
  if (GVar3 != 0) {
    local_a0 = local_90;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Got Error ","");
    local_40 = glu::getErrorName;
    local_38 = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_c0,&local_40);
    uVar11 = 0xf;
    if (local_a0 != local_90) {
      uVar11 = local_90[0];
    }
    if (uVar11 < local_c0._M_string_length + local_98) {
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        uVar12 = local_c0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_c0._M_string_length + local_98) goto LAB_0154cf43;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,(ulong)local_a0);
    }
    else {
LAB_0154cf43:
      puVar4 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_c0._M_dataplus._M_p);
    }
    local_e8 = &local_d8;
    plVar5 = puVar4 + 2;
    if ((long *)*puVar4 == plVar5) {
      local_d8 = *plVar5;
      uStack_d0 = puVar4[3];
    }
    else {
      local_d8 = *plVar5;
      local_e8 = (long *)*puVar4;
    }
    local_e0 = puVar4[1];
    *puVar4 = plVar5;
    puVar4[1] = 0;
    *(undefined1 *)plVar5 = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_e8);
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_60 = *plVar8;
      lStack_58 = plVar5[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar8;
      local_70 = (long *)*plVar5;
    }
    local_68 = plVar5[1];
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    psVar9 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_138.field_2._M_allocated_capacity = *psVar9;
      local_138.field_2._8_8_ = plVar5[3];
    }
    else {
      local_138.field_2._M_allocated_capacity = *psVar9;
      local_138._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_138._M_string_length = plVar5[1];
    *plVar5 = (long)psVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    tcu::ResultCollector::fail(local_110,&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if (local_a0 != local_90) {
      operator_delete(local_a0,local_90[0] + 1);
    }
  }
  if ((iVar2 < 1) || (local_108._M_dataplus._M_p[((ulong)gl & 0xffffffff) - 1] == '\0')) {
    if ((local_108._M_dataplus._M_p[iVar2] != 'X') &&
       (local_108._M_dataplus._M_p[iVar2 + 1] != '\0')) {
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,
                 "Buffer end guard modified, query wrote over the end of the buffer.","");
      tcu::ResultCollector::fail(local_110,&local_138);
      goto LAB_0154d181;
    }
  }
  else {
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_138,
               "Return buffer was not INFO_LOG_LENGTH sized and null-terminated","");
    tcu::ResultCollector::fail(local_110,&local_138);
LAB_0154d181:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
  }
  paVar14 = &local_108.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar14) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  tcu::TestLog::endSection(local_c8.m_log);
  pTVar1 = (TestLog *)(local_78->m_prefix)._M_dataplus._M_p;
  local_108._M_dataplus._M_p = (pointer)paVar14;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"QueryMore","");
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"Query more","");
  tcu::ScopedLogSection::ScopedLogSection(&local_c8,pTVar1,&local_108,&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar14) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  local_108._M_dataplus._M_p = (pointer)paVar14;
  std::__cxx11::string::_M_construct((ulong)&local_108,(char)gl + '\x04');
  local_114 = -1;
  local_108._M_dataplus._M_p[iVar2 + 3] = '\0';
  pcVar7 = pcVar13;
  if ((object & 1) != 0) {
    pcVar7 = *(code **)(pcVar13 + *local_48 + -1);
  }
  (*pcVar7)(local_48,local_7c,iVar10,&local_114,local_108._M_dataplus._M_p);
  GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_78);
  if (GVar3 != 0) {
    local_a0 = local_90;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Got Error ","");
    local_40 = glu::getErrorName;
    local_38 = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_c0,&local_40);
    uVar11 = 0xf;
    if (local_a0 != local_90) {
      uVar11 = local_90[0];
    }
    if (uVar11 < local_c0._M_string_length + local_98) {
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        uVar12 = local_c0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_c0._M_string_length + local_98) goto LAB_0154d360;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,(ulong)local_a0);
    }
    else {
LAB_0154d360:
      puVar4 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_c0._M_dataplus._M_p);
    }
    local_e8 = &local_d8;
    plVar5 = puVar4 + 2;
    if ((long *)*puVar4 == plVar5) {
      local_d8 = *plVar5;
      uStack_d0 = puVar4[3];
    }
    else {
      local_d8 = *plVar5;
      local_e8 = (long *)*puVar4;
    }
    local_e0 = puVar4[1];
    *puVar4 = plVar5;
    puVar4[1] = 0;
    *(undefined1 *)plVar5 = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_e8);
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_60 = *plVar8;
      lStack_58 = plVar5[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar8;
      local_70 = (long *)*plVar5;
    }
    local_68 = plVar5[1];
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    psVar9 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_138.field_2._M_allocated_capacity = *psVar9;
      local_138.field_2._8_8_ = plVar5[3];
    }
    else {
      local_138.field_2._M_allocated_capacity = *psVar9;
      local_138._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_138._M_string_length = plVar5[1];
    *plVar5 = (long)psVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    tcu::ResultCollector::fail(local_110,&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if (local_a0 != local_90) {
      operator_delete(local_a0,local_90[0] + 1);
    }
  }
  iVar10 = local_114;
  if ((long)local_114 == -1) {
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_138,"\'length\' was not written to","");
    tcu::ResultCollector::fail(local_110,&local_138);
LAB_0154d6aa:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
LAB_0154d6b8:
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if (local_108._M_dataplus._M_p[local_114] != '\0') {
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,
                 "Either length was incorrect or result was not null-terminated","");
      tcu::ResultCollector::fail(local_110,&local_138);
      goto LAB_0154d6aa;
    }
    if ((iVar2 != 0) && (iVar2 < local_114 + 1)) {
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,
                 "\'length\' characters + null terminator is larger than INFO_LOG_LENGTH","");
      tcu::ResultCollector::fail(local_110,&local_138);
      goto LAB_0154d6aa;
    }
    if (local_114 + 1 < iVar2) {
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"\'length\' is not consistent with INFO_LOG_LENGTH","");
      tcu::ResultCollector::fail(local_110,&local_138);
      goto LAB_0154d6aa;
    }
    if ((local_108._M_dataplus._M_p[local_50] != 'X') &&
       (local_108._M_dataplus._M_p[iVar2 + 3] != '\0')) {
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,
                 "Buffer end guard modified, query wrote over the end of the buffer.","");
      tcu::ResultCollector::fail(local_110,&local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p == &local_138.field_2) goto LAB_0154d6c5;
      goto LAB_0154d6b8;
    }
    sVar6 = strlen(local_108._M_dataplus._M_p);
    if (iVar10 != (int)sVar6) {
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"\'length\' and written string length do not match","");
      tcu::ResultCollector::fail(local_110,&local_138);
      goto LAB_0154d6aa;
    }
  }
LAB_0154d6c5:
  paVar14 = &local_108.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar14) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  tcu::TestLog::endSection(local_c8.m_log);
  if (2 < iVar2) {
    pTVar1 = (TestLog *)(local_78->m_prefix)._M_dataplus._M_p;
    local_108._M_dataplus._M_p = (pointer)paVar14;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"QueryLess","");
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"Query less","");
    tcu::ScopedLogSection::ScopedLogSection(&local_c8,pTVar1,&local_108,&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar14) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    local_108._M_dataplus._M_p = (pointer)paVar14;
    std::__cxx11::string::_M_construct((ulong)&local_108,(char)local_50);
    local_114 = -1;
    pcVar7 = pcVar13;
    if ((object & 1) != 0) {
      pcVar7 = *(code **)(pcVar13 + *local_48 + -1);
    }
    (*pcVar7)(local_48,local_7c,2,&local_114,local_108._M_dataplus._M_p);
    GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_78);
    if (GVar3 != 0) {
      local_a0 = local_90;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Got Error ","");
      local_40 = glu::getErrorName;
      local_38 = GVar3;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_c0,&local_40);
      uVar11 = 0xf;
      if (local_a0 != local_90) {
        uVar11 = local_90[0];
      }
      if (uVar11 < local_c0._M_string_length + local_98) {
        uVar12 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          uVar12 = local_c0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar12 < local_c0._M_string_length + local_98) goto LAB_0154d881;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,(ulong)local_a0);
      }
      else {
LAB_0154d881:
        puVar4 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_c0._M_dataplus._M_p)
        ;
      }
      local_e8 = &local_d8;
      plVar5 = puVar4 + 2;
      if ((long *)*puVar4 == plVar5) {
        local_d8 = *plVar5;
        uStack_d0 = puVar4[3];
      }
      else {
        local_d8 = *plVar5;
        local_e8 = (long *)*puVar4;
      }
      local_e0 = puVar4[1];
      *puVar4 = plVar5;
      puVar4[1] = 0;
      *(undefined1 *)plVar5 = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_e8);
      plVar8 = plVar5 + 2;
      if ((long *)*plVar5 == plVar8) {
        local_60 = *plVar8;
        lStack_58 = plVar5[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar8;
        local_70 = (long *)*plVar5;
      }
      local_68 = plVar5[1];
      *plVar5 = (long)plVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      psVar9 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_138.field_2._M_allocated_capacity = *psVar9;
        local_138.field_2._8_8_ = plVar5[3];
      }
      else {
        local_138.field_2._M_allocated_capacity = *psVar9;
        local_138._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_138._M_string_length = plVar5[1];
      *plVar5 = (long)psVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      tcu::ResultCollector::fail(local_110,&local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      if (local_e8 != &local_d8) {
        operator_delete(local_e8,local_d8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if (local_a0 != local_90) {
        operator_delete(local_a0,local_90[0] + 1);
      }
    }
    if (local_114 == 1) {
      if (local_108._M_dataplus._M_p[1] != '\0') {
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_138,"Expected null terminator at index 1","");
        tcu::ResultCollector::fail(local_110,&local_138);
        goto LAB_0154dad9;
      }
    }
    else {
      if (local_114 == -1) {
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_138,"\'length\' was not written to","");
        tcu::ResultCollector::fail(local_110,&local_138);
      }
      else {
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_138,"Expected \'length\' = 1","");
        tcu::ResultCollector::fail(local_110,&local_138);
      }
LAB_0154dad9:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar14) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    tcu::TestLog::endSection(local_c8.m_log);
  }
  if (0 < iVar2) {
    pTVar1 = (TestLog *)(local_78->m_prefix)._M_dataplus._M_p;
    local_108._M_dataplus._M_p = (pointer)paVar14;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"QueryOne","");
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"Query one character","");
    tcu::ScopedLogSection::ScopedLogSection(&local_c8,pTVar1,&local_108,&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar14) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    local_108._M_dataplus._M_p = (pointer)paVar14;
    std::__cxx11::string::_M_construct((ulong)&local_108,(char)local_50);
    local_114 = -1;
    pcVar7 = pcVar13;
    if ((object & 1) != 0) {
      pcVar7 = *(code **)(pcVar13 + *local_48 + -1);
    }
    (*pcVar7)(local_48,local_7c,1,&local_114,local_108._M_dataplus._M_p);
    GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_78);
    if (GVar3 != 0) {
      local_a0 = local_90;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Got Error ","");
      local_40 = glu::getErrorName;
      local_38 = GVar3;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_c0,&local_40);
      uVar11 = 0xf;
      if (local_a0 != local_90) {
        uVar11 = local_90[0];
      }
      if (uVar11 < local_c0._M_string_length + local_98) {
        uVar12 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          uVar12 = local_c0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar12 < local_c0._M_string_length + local_98) goto LAB_0154dcaa;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,(ulong)local_a0);
      }
      else {
LAB_0154dcaa:
        puVar4 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_c0._M_dataplus._M_p)
        ;
      }
      local_e8 = &local_d8;
      plVar5 = puVar4 + 2;
      if ((long *)*puVar4 == plVar5) {
        local_d8 = *plVar5;
        uStack_d0 = puVar4[3];
      }
      else {
        local_d8 = *plVar5;
        local_e8 = (long *)*puVar4;
      }
      local_e0 = puVar4[1];
      *puVar4 = plVar5;
      puVar4[1] = 0;
      *(undefined1 *)plVar5 = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_e8);
      plVar8 = plVar5 + 2;
      if ((long *)*plVar5 == plVar8) {
        local_60 = *plVar8;
        lStack_58 = plVar5[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar8;
        local_70 = (long *)*plVar5;
      }
      local_68 = plVar5[1];
      *plVar5 = (long)plVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      psVar9 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_138.field_2._M_allocated_capacity = *psVar9;
        local_138.field_2._8_8_ = plVar5[3];
      }
      else {
        local_138.field_2._M_allocated_capacity = *psVar9;
        local_138._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_138._M_string_length = plVar5[1];
      *plVar5 = (long)psVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      tcu::ResultCollector::fail(local_110,&local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      if (local_e8 != &local_d8) {
        operator_delete(local_e8,local_d8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if (local_a0 != local_90) {
        operator_delete(local_a0,local_90[0] + 1);
      }
    }
    paVar15 = &local_138.field_2;
    if (local_114 == 0) {
      if (*local_108._M_dataplus._M_p != '\0') {
        local_138._M_dataplus._M_p = (pointer)paVar15;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_138,"Expected null terminator at index 0","");
        tcu::ResultCollector::fail(local_110,&local_138);
        goto LAB_0154def6;
      }
    }
    else {
      if (local_114 == -1) {
        local_138._M_dataplus._M_p = (pointer)paVar15;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_138,"\'length\' was not written to","");
        tcu::ResultCollector::fail(local_110,&local_138);
      }
      else {
        local_138._M_dataplus._M_p = (pointer)paVar15;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_138,"Expected \'length\' = 0","");
        tcu::ResultCollector::fail(local_110,&local_138);
      }
LAB_0154def6:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar15) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar14) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    tcu::TestLog::endSection(local_c8.m_log);
  }
  pTVar1 = (TestLog *)(local_78->m_prefix)._M_dataplus._M_p;
  local_108._M_dataplus._M_p = (pointer)paVar14;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"QueryNone","");
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_138,"Query to zero-sized buffer","");
  tcu::ScopedLogSection::ScopedLogSection(&local_c8,pTVar1,&local_108,&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar14) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  local_108._M_dataplus._M_p = (pointer)paVar14;
  std::__cxx11::string::_M_construct((ulong)&local_108,(char)local_50);
  local_114 = -1;
  if ((object & 1) != 0) {
    pcVar13 = *(code **)(pcVar13 + *local_48 + -1);
  }
  (*pcVar13)(local_48,local_7c,0,&local_114,local_108._M_dataplus._M_p);
  GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_78);
  if (GVar3 != 0) {
    local_a0 = local_90;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Got Error ","");
    local_40 = glu::getErrorName;
    local_38 = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_c0,&local_40);
    uVar11 = 0xf;
    if (local_a0 != local_90) {
      uVar11 = local_90[0];
    }
    if (uVar11 < local_c0._M_string_length + local_98) {
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        uVar12 = local_c0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_c0._M_string_length + local_98) goto LAB_0154e0ad;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,(ulong)local_a0);
    }
    else {
LAB_0154e0ad:
      puVar4 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_c0._M_dataplus._M_p);
    }
    local_e8 = &local_d8;
    plVar5 = puVar4 + 2;
    if ((long *)*puVar4 == plVar5) {
      local_d8 = *plVar5;
      uStack_d0 = puVar4[3];
    }
    else {
      local_d8 = *plVar5;
      local_e8 = (long *)*puVar4;
    }
    local_e0 = puVar4[1];
    *puVar4 = plVar5;
    puVar4[1] = 0;
    *(undefined1 *)plVar5 = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_e8);
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_60 = *plVar8;
      lStack_58 = plVar5[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar8;
      local_70 = (long *)*plVar5;
    }
    local_68 = plVar5[1];
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    psVar9 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_138.field_2._M_allocated_capacity = *psVar9;
      local_138.field_2._8_8_ = plVar5[3];
    }
    else {
      local_138.field_2._M_allocated_capacity = *psVar9;
      local_138._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_138._M_string_length = plVar5[1];
    *plVar5 = (long)psVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    tcu::ResultCollector::fail(local_110,&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if (local_a0 != local_90) {
      operator_delete(local_a0,local_90[0] + 1);
    }
  }
  paVar15 = &local_138.field_2;
  if (local_114 == 0) {
    if (*local_108._M_dataplus._M_p == 'X') goto LAB_0154e30f;
    local_138._M_dataplus._M_p = (pointer)paVar15;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_138,"Unexpected buffer mutation at index 0","");
    tcu::ResultCollector::fail(local_110,&local_138);
  }
  else if (local_114 == -1) {
    local_138._M_dataplus._M_p = (pointer)paVar15;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_138,"\'length\' was not written to","");
    tcu::ResultCollector::fail(local_110,&local_138);
  }
  else {
    local_138._M_dataplus._M_p = (pointer)paVar15;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_138,"Expected \'length\' = 0","");
    tcu::ResultCollector::fail(local_110,&local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar15) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
LAB_0154e30f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar14) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  tcu::TestLog::endSection(local_c8.m_log);
  return;
}

Assistant:

void verifyInfoLogQuery (tcu::ResultCollector&			result,
						 glu::CallLogWrapper&			gl,
						 int							logLen,
						 glw::GLuint					object,
						 void (glu::CallLogWrapper::*	getInfoLog)(glw::GLuint, glw::GLsizei, glw::GLsizei*, glw::GLchar*),
						 const char*					getterName)
{
	{
		const tcu::ScopedLogSection	section	(gl.getLog(), "QueryAll", "Query all");
		std::string					buf		(logLen + 2, 'X');

		buf[logLen + 1] = '\0';
		(gl.*getInfoLog)(object, logLen, DE_NULL, &buf[0]);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), getterName);

		if (logLen > 0 && buf[logLen-1] != '\0')
			result.fail("Return buffer was not INFO_LOG_LENGTH sized and null-terminated");
		else if (buf[logLen] != 'X' && buf[logLen+1] != '\0')
			result.fail("Buffer end guard modified, query wrote over the end of the buffer.");
	}

	{
		const tcu::ScopedLogSection section	(gl.getLog(), "QueryMore", "Query more");
		std::string					buf		(logLen + 4, 'X');
		int							written	= -1;

		buf[logLen + 3] = '\0';
		(gl.*getInfoLog)(object, logLen+2, &written, &buf[0]);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), getterName);

		if (written == -1)
			result.fail("'length' was not written to");
		else if (buf[written] != '\0')
			result.fail("Either length was incorrect or result was not null-terminated");
		else if (logLen != 0 && (written + 1) > logLen)
			result.fail("'length' characters + null terminator is larger than INFO_LOG_LENGTH");
		else if ((written + 1) < logLen)
			result.fail("'length' is not consistent with INFO_LOG_LENGTH");
		else if (buf[logLen+2] != 'X' && buf[logLen+3] != '\0')
			result.fail("Buffer end guard modified, query wrote over the end of the buffer.");
		else if (written != (int)strlen(&buf[0]))
			result.fail("'length' and written string length do not match");
	}

	if (logLen > 2)
	{
		const tcu::ScopedLogSection section	(gl.getLog(), "QueryLess", "Query less");
		std::string					buf		(logLen + 2, 'X');
		int							written	= -1;

		(gl.*getInfoLog)(object, 2, &written, &buf[0]);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), getterName);

		if (written == -1)
			result.fail("'length' was not written to");
		else if (written != 1)
			result.fail("Expected 'length' = 1");
		else if (buf[1] != '\0')
			result.fail("Expected null terminator at index 1");
	}

	if (logLen > 0)
	{
		const tcu::ScopedLogSection section	(gl.getLog(), "QueryOne", "Query one character");
		std::string					buf		(logLen + 2, 'X');
		int							written	= -1;

		(gl.*getInfoLog)(object, 1, &written, &buf[0]);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), getterName);

		if (written == -1)
			result.fail("'length' was not written to");
		else if (written != 0)
			result.fail("Expected 'length' = 0");
		else if (buf[0] != '\0')
			result.fail("Expected null terminator at index 0");
	}

	{
		const tcu::ScopedLogSection section	(gl.getLog(), "QueryNone", "Query to zero-sized buffer");
		std::string					buf		(logLen + 2, 'X');
		int							written	= -1;

		(gl.*getInfoLog)(object, 0, &written, &buf[0]);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), getterName);

		if (written == -1)
			result.fail("'length' was not written to");
		else if (written != 0)
			result.fail("Expected 'length' = 0");
		else if (buf[0] != 'X')
			result.fail("Unexpected buffer mutation at index 0");
	}
}